

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O2

void duckdb::IntegralDecompressFunction<unsigned_char,int>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  idx_t count;
  int *piVar2;
  byte *pbVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  long lVar6;
  uchar *puVar7;
  optional_idx oVar8;
  reference pvVar9;
  Vector *vector;
  idx_t iVar10;
  SelectionVector *sel;
  idx_t i_1;
  idx_t i;
  idx_t iVar11;
  undefined1 in_stack_ffffffffffffff68;
  int min_val;
  int *local_88;
  int *local_80;
  optional_idx dict_size;
  data_ptr_t local_70;
  unsigned_long *local_68;
  
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  min_val = *(int *)pvVar9->data;
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  VVar1 = pvVar9->vector_type;
  local_88 = &min_val;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    piVar2 = (int *)result->data;
    puVar7 = pvVar9->data;
    FlatVector::VerifyFlatVector(pvVar9);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_char,int,duckdb::UnaryLambdaWrapper,duckdb::IntegralDecompressFunction<unsigned_char,int>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_char_const&)_1_>
              (puVar7,piVar2,count,&pvVar9->validity,&result->validity,&local_88,
               (bool)in_stack_ffffffffffffff68);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      dict_size = DictionaryVector::DictionarySize(pvVar9);
      if (((dict_size.index != 0xffffffffffffffff) &&
          (iVar11 = optional_idx::GetIndex(&dict_size), iVar11 * 2 <= count)) &&
         (vector = DictionaryVector::Child(pvVar9), vector->vector_type == FLAT_VECTOR)) {
        local_80 = (int *)result->data;
        puVar7 = vector->data;
        iVar11 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        UnaryExecutor::
        ExecuteFlat<unsigned_char,int,duckdb::UnaryLambdaWrapper,duckdb::IntegralDecompressFunction<unsigned_char,int>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_char_const&)_1_>
                  (puVar7,local_80,iVar11,&vector->validity,&result->validity,&local_88,
                   (bool)in_stack_ffffffffffffff68);
        sel = DictionaryVector::SelVector(pvVar9);
        iVar11 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar11,sel,count);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      piVar2 = (int *)result->data;
      pbVar3 = pvVar9->data;
      puVar4 = (pvVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      *piVar2 = (uint)*pbVar3 + min_val;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(pvVar9,count,(UnifiedVectorFormat *)&dict_size);
    Vector::SetVectorType(result,FLAT_VECTOR);
    oVar8 = dict_size;
    pdVar5 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == (unsigned_long *)0x0) {
      for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
        lVar6 = *(long *)oVar8.index;
        iVar10 = iVar11;
        if (lVar6 != 0) {
          iVar10 = (idx_t)*(uint *)(lVar6 + iVar11 * 4);
        }
        *(uint *)(pdVar5 + iVar11 * 4) = (uint)local_70[iVar10] + min_val;
      }
    }
    else {
      for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
        lVar6 = *(long *)oVar8.index;
        iVar10 = iVar11;
        if (lVar6 != 0) {
          iVar10 = (idx_t)*(uint *)(lVar6 + iVar11 * 4);
        }
        if ((local_68[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        }
        else {
          *(uint *)(pdVar5 + iVar11 * 4) = (uint)local_70[iVar10] + min_val;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static void IntegralDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	D_ASSERT(args.data[1].GetType() == result.GetType());
	const auto min_val = ConstantVector::GetData<RESULT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralDecompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}